

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
llvm::ItaniumPartialDemangler::~ItaniumPartialDemangler(ItaniumPartialDemangler *this)

{
  void *pvVar1;
  
  pvVar1 = this->Context;
  if (pvVar1 != (void *)0x0) {
    anon_unknown.dwarf_1adff5::BumpPointerAllocator::reset
              ((BumpPointerAllocator *)((long)pvVar1 + 0x2f0));
    if (*(void **)((long)pvVar1 + 0x298) != (void *)((long)pvVar1 + 0x2b0)) {
      free(*(void **)((long)pvVar1 + 0x298));
    }
    if (*(void **)((long)pvVar1 + 0x240) != (void *)((long)pvVar1 + 600)) {
      free(*(void **)((long)pvVar1 + 0x240));
    }
    if (*(void **)((long)pvVar1 + 0x128) != (void *)((long)pvVar1 + 0x140)) {
      free(*(void **)((long)pvVar1 + 0x128));
    }
    if (*(void **)((long)pvVar1 + 0x10) != (void *)((long)pvVar1 + 0x28)) {
      free(*(void **)((long)pvVar1 + 0x10));
    }
  }
  operator_delete(pvVar1,0x1300);
  return;
}

Assistant:

ItaniumPartialDemangler::~ItaniumPartialDemangler() {
  delete static_cast<Db *>(Context);
}